

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void SubtractionHelper<long,unsigned_int,19>::
     SubtractThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               (long *lhs,uint *rhs,uint *result)

{
  uint uVar1;
  long lVar2;
  undefined4 *in_RDX;
  uint *in_RSI;
  long *in_RDI;
  uint64_t tmp;
  
  lVar2 = *in_RDI - (ulong)*in_RSI;
  uVar1 = std::numeric_limits<unsigned_int>::max();
  if (lVar2 <= (long)(ulong)uVar1) {
    uVar1 = std::numeric_limits<unsigned_int>::min();
    if ((long)(ulong)uVar1 <= lVar2) {
      *in_RDX = (int)lVar2;
      return;
    }
  }
  safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
}

Assistant:

SAFEINT_CONSTEXPR14 static void SubtractThrow( const U& lhs, const T& rhs, T& result ) SAFEINT_CPP_THROW
    {
        // Do this as unsigned to prevent unwanted optimizations
        std::uint64_t tmp = (std::uint64_t)lhs - (std::uint64_t)rhs;

        if( (std::int64_t)tmp <= std::numeric_limits<T>::max() && (std::int64_t)tmp >= std::numeric_limits<T>::min() )
        {
            result = (T)(std::int64_t)tmp;
            return;
        }

        E::SafeIntOnOverflow();
    }